

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall google::protobuf::io::CordInputStream::BackUp(CordInputStream *this,int count)

{
  ulong uVar1;
  
  uVar1 = (ulong)count;
  if (uVar1 <= this->size_ - this->available_) {
    this->available_ = this->available_ + uVar1;
    this->bytes_remaining_ = this->bytes_remaining_ + uVar1;
    return;
  }
  BackUp();
}

Assistant:

void CordInputStream::BackUp(int count) {
  // Backup is only allowed on last returned chunk from `Next()`.
  ABSL_CHECK_LE(static_cast<size_t>(count), size_ - available_);

  available_ += count;
  bytes_remaining_ += count;
}